

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::swapPayload(Value *this,Value *other)

{
  ushort uVar1;
  int temp2;
  ValueType temp;
  Value *other_local;
  Value *this_local;
  
  uVar1 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 =
       *(ushort *)&this->field_0x8 & 0xff00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&other->field_0x8 = *(ushort *)&other->field_0x8 & 0xff00 | uVar1 & 0xff;
  std::swap<Json::Value::ValueHolder>(&this->value_,&other->value_);
  uVar1 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 =
       *(ushort *)&this->field_0x8 & 0xfeff | (*(ushort *)&other->field_0x8 >> 8 & 1) << 8;
  *(ushort *)&other->field_0x8 = *(ushort *)&other->field_0x8 & 0xfeff | (uVar1 >> 8 & 1) << 8;
  return;
}

Assistant:

void Value::swapPayload(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2 & 0x1;
}